

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_gainer_config ma_gainer_config_init(ma_uint32 channels,ma_uint32 smoothTimeInFrames)

{
  ma_gainer_config mVar1;
  ma_uint32 in_ESI;
  ma_uint32 in_EDI;
  ma_gainer_config config;
  undefined1 local_18 [8];
  undefined8 local_10;
  undefined1 *local_8;
  
  local_8 = local_18;
  local_10 = 8;
  if (local_8 != (undefined1 *)0x0) {
    memset(local_8,0,8);
  }
  mVar1.smoothTimeInFrames = in_ESI;
  mVar1.channels = in_EDI;
  return mVar1;
}

Assistant:

MA_API ma_gainer_config ma_gainer_config_init(ma_uint32 channels, ma_uint32 smoothTimeInFrames)
{
    ma_gainer_config config;

    MA_ZERO_OBJECT(&config);
    config.channels           = channels;
    config.smoothTimeInFrames = smoothTimeInFrames;

    return config;
}